

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledevice.cpp
# Opt level: O0

bool __thiscall QFileDevice::seek(QFileDevice *this,qint64 off)

{
  bool bVar1;
  uint uVar2;
  FileError FVar3;
  QFileDevicePrivate *this_00;
  pointer pQVar4;
  undefined8 in_RSI;
  QMessageLogger *in_RDI;
  long in_FS_OFFSET;
  FileError err;
  QFileDevicePrivate *d;
  undefined4 in_stack_ffffffffffffff78;
  FileError in_stack_ffffffffffffff7c;
  QAbstractFileEngine *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  bool local_41;
  QMessageLogger local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QFileDevice *)0x2a8035);
  bVar1 = QIODevice::isOpen((QIODevice *)in_stack_ffffffffffffff80);
  if (bVar1) {
    bVar1 = QFileDevicePrivate::ensureFlushed
                      ((QFileDevicePrivate *)
                       CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    if (bVar1) {
      pQVar4 = std::unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>::
               operator->((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
                           *)0x2a80a1);
      uVar2 = (*pQVar4->_vptr_QAbstractFileEngine[8])(pQVar4,in_RSI);
      if (((uVar2 & 1) == 0) ||
         (bVar1 = QIODevice::seek((QIODevice *)
                                  CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                                  (qint64)in_RDI), !bVar1)) {
        std::unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>::operator->
                  ((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_> *)
                   0x2a80dd);
        FVar3 = QAbstractFileEngine::error(in_stack_ffffffffffffff80);
        if (FVar3 == UnspecifiedError) {
          FVar3 = PositionError;
        }
        std::unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>::operator->
                  ((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_> *)
                   0x2a811b);
        QAbstractFileEngine::errorString
                  ((QAbstractFileEngine *)CONCAT44(FVar3,in_stack_ffffffffffffff88));
        QFileDevicePrivate::setError(this_00,in_stack_ffffffffffffff7c,(QString *)0x2a813b);
        QString::~QString((QString *)0x2a8145);
        local_41 = false;
      }
      else {
        unsetError((QFileDevice *)in_stack_ffffffffffffff80);
        local_41 = true;
      }
    }
    else {
      local_41 = false;
    }
  }
  else {
    QMessageLogger::QMessageLogger
              (in_RDI,(char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
               (int)((ulong)in_stack_ffffffffffffff80 >> 0x20),
               (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    QMessageLogger::warning(&local_28,"QFileDevice::seek: IODevice is not open");
    local_41 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_41;
}

Assistant:

bool QFileDevice::seek(qint64 off)
{
    Q_D(QFileDevice);
    if (!isOpen()) {
        qWarning("QFileDevice::seek: IODevice is not open");
        return false;
    }

    if (!d->ensureFlushed())
        return false;

    if (!d->fileEngine->seek(off) || !QIODevice::seek(off)) {
        QFileDevice::FileError err = d->fileEngine->error();
        if (err == QFileDevice::UnspecifiedError)
            err = QFileDevice::PositionError;
        d->setError(err, d->fileEngine->errorString());
        return false;
    }
    unsetError();
    return true;
}